

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p5_pbev2.cc
# Opt level: O1

int PKCS5_pbe2_encrypt_init
              (CBB *out,EVP_CIPHER_CTX *ctx,EVP_CIPHER *cipher,uint32_t iterations,char *pass,
              size_t pass_len,uint8_t *salt,size_t salt_len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  EVP_MD *pbkdf2_md;
  int iVar5;
  uint8_t iv [16];
  CBB kdf_param;
  CBB cipher_cbb;
  CBB kdf;
  CBB param;
  CBB algorithm;
  
  iVar1 = EVP_CIPHER_nid((EVP_CIPHER *)cipher);
  if (iVar1 == 0) {
    iVar2 = 0;
    ERR_put_error(0x13,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                  ,0x87);
  }
  else {
    iVar2 = EVP_CIPHER_iv_length((EVP_CIPHER *)cipher);
    iVar2 = RAND_bytes(iv,iVar2);
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      iVar3 = CBB_add_asn1(out,&algorithm,0x20000010);
      iVar5 = 0;
      iVar2 = 0;
      if (((((iVar3 != 0) &&
            (iVar3 = CBB_add_asn1_element(&algorithm,6,kPBES2,9), iVar2 = iVar5, iVar3 != 0)) &&
           (iVar3 = CBB_add_asn1(&algorithm,&param,0x20000010), iVar3 != 0)) &&
          ((iVar3 = CBB_add_asn1(&param,&kdf,0x20000010), iVar3 != 0 &&
           (iVar3 = CBB_add_asn1_element(&kdf,6,kPBKDF2,9), iVar3 != 0)))) &&
         ((iVar3 = CBB_add_asn1(&kdf,&kdf_param,0x20000010), iVar3 != 0 &&
          ((iVar3 = CBB_add_asn1_octet_string(&kdf_param,salt,salt_len), iVar3 != 0 &&
           (iVar3 = CBB_add_asn1_uint64(&kdf_param,(ulong)iterations), iVar3 != 0)))))) {
        if (iVar1 == 0x25) {
          uVar4 = EVP_CIPHER_key_length((EVP_CIPHER *)cipher);
          iVar3 = CBB_add_asn1_uint64(&kdf_param,(ulong)uVar4);
          if (iVar3 == 0) {
            return 0;
          }
        }
        iVar3 = CBB_add_asn1(&param,&cipher_cbb,0x20000010);
        if ((iVar3 != 0) && (iVar1 = add_cipher_oid(&cipher_cbb,iVar1), iVar1 != 0)) {
          uVar4 = EVP_CIPHER_iv_length((EVP_CIPHER *)cipher);
          iVar1 = CBB_add_asn1_octet_string(&cipher_cbb,iv,(ulong)uVar4);
          if ((iVar1 != 0) && (iVar1 = CBB_flush(out), iVar1 != 0)) {
            pbkdf2_md = EVP_sha1();
            uVar4 = EVP_CIPHER_iv_length((EVP_CIPHER *)cipher);
            iVar2 = pkcs5_pbe2_cipher_init
                              (ctx,cipher,(EVP_MD *)pbkdf2_md,iterations,pass,pass_len,salt,salt_len
                               ,iv,(ulong)uVar4,1);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int PKCS5_pbe2_encrypt_init(CBB *out, EVP_CIPHER_CTX *ctx,
                            const EVP_CIPHER *cipher, uint32_t iterations,
                            const char *pass, size_t pass_len,
                            const uint8_t *salt, size_t salt_len) {
  int cipher_nid = EVP_CIPHER_nid(cipher);
  if (cipher_nid == NID_undef) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_CIPHER_HAS_NO_OBJECT_IDENTIFIER);
    return 0;
  }

  // Generate a random IV.
  uint8_t iv[EVP_MAX_IV_LENGTH];
  if (!RAND_bytes(iv, EVP_CIPHER_iv_length(cipher))) {
    return 0;
  }

  // See RFC 2898, appendix A.
  CBB algorithm, param, kdf, kdf_param, cipher_cbb;
  if (!CBB_add_asn1(out, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, kPBES2,
                            sizeof(kPBES2)) ||
      !CBB_add_asn1(&algorithm, &param, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1(&param, &kdf, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&kdf, CBS_ASN1_OBJECT, kPBKDF2, sizeof(kPBKDF2)) ||
      !CBB_add_asn1(&kdf, &kdf_param, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_octet_string(&kdf_param, salt, salt_len) ||
      !CBB_add_asn1_uint64(&kdf_param, iterations) ||
      // Specify a key length for RC2.
      (cipher_nid == NID_rc2_cbc &&
       !CBB_add_asn1_uint64(&kdf_param, EVP_CIPHER_key_length(cipher))) ||
      // Omit the PRF. We use the default hmacWithSHA1.
      // TODO(crbug.com/396434682): Improve this defaults.
      !CBB_add_asn1(&param, &cipher_cbb, CBS_ASN1_SEQUENCE) ||
      !add_cipher_oid(&cipher_cbb, cipher_nid) ||
      // RFC 2898 says RC2-CBC and RC5-CBC-Pad use a SEQUENCE with version and
      // IV, but OpenSSL always uses an OCTET STRING IV, so we do the same.
      !CBB_add_asn1_octet_string(&cipher_cbb, iv,
                                 EVP_CIPHER_iv_length(cipher)) ||
      !CBB_flush(out)) {
    return 0;
  }

  return pkcs5_pbe2_cipher_init(ctx, cipher, EVP_sha1(), iterations, pass,
                                pass_len, salt, salt_len, iv,
                                EVP_CIPHER_iv_length(cipher), 1 /* encrypt */);
}